

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNsPtr xmlNewReconciledNs(xmlDocPtr doc,xmlNodePtr tree,xmlNsPtr ns)

{
  xmlNsPtr pxVar1;
  uint uVar2;
  xmlChar prefix [50];
  xmlChar local_68 [56];
  
  pxVar1 = (xmlNsPtr)0x0;
  if ((ns != (xmlNsPtr)0x0) && (tree->type == XML_ELEMENT_NODE)) {
    if (ns->type == XML_NAMESPACE_DECL) {
      pxVar1 = xmlSearchNsByHref(doc,tree,ns->href);
      if (pxVar1 == (xmlNsPtr)0x0) {
        if (ns->prefix == (xmlChar *)0x0) {
          builtin_memcpy(local_68,"default",8);
        }
        else {
          snprintf((char *)local_68,0x32,"%.20s");
        }
        pxVar1 = xmlSearchNs(doc,tree,local_68);
        if (pxVar1 != (xmlNsPtr)0x0) {
          uVar2 = 1;
          do {
            if (uVar2 == 0x3e9) {
              return (xmlNsPtr)0x0;
            }
            if (ns->prefix == (xmlChar *)0x0) {
              snprintf((char *)local_68,0x32,"default%d",(ulong)uVar2);
            }
            else {
              snprintf((char *)local_68,0x32,"%.20s%d",ns->prefix,(ulong)uVar2);
            }
            uVar2 = uVar2 + 1;
            pxVar1 = xmlSearchNs(doc,tree,local_68);
          } while (pxVar1 != (xmlNsPtr)0x0);
        }
        pxVar1 = xmlNewNs(tree,ns->href,local_68);
      }
    }
    else {
      pxVar1 = (xmlNsPtr)0x0;
    }
  }
  return pxVar1;
}

Assistant:

static xmlNsPtr
xmlNewReconciledNs(xmlDocPtr doc, xmlNodePtr tree, xmlNsPtr ns) {
    xmlNsPtr def;
    xmlChar prefix[50];
    int counter = 1;

    if ((tree == NULL) || (tree->type != XML_ELEMENT_NODE)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewReconciledNs : tree == NULL\n");
#endif
	return(NULL);
    }
    if ((ns == NULL) || (ns->type != XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewReconciledNs : ns == NULL\n");
#endif
	return(NULL);
    }
    /*
     * Search an existing namespace definition inherited.
     */
    def = xmlSearchNsByHref(doc, tree, ns->href);
    if (def != NULL)
        return(def);

    /*
     * Find a close prefix which is not already in use.
     * Let's strip namespace prefixes longer than 20 chars !
     */
    if (ns->prefix == NULL)
	snprintf((char *) prefix, sizeof(prefix), "default");
    else
	snprintf((char *) prefix, sizeof(prefix), "%.20s", (char *)ns->prefix);

    def = xmlSearchNs(doc, tree, prefix);
    while (def != NULL) {
        if (counter > 1000) return(NULL);
	if (ns->prefix == NULL)
	    snprintf((char *) prefix, sizeof(prefix), "default%d", counter++);
	else
	    snprintf((char *) prefix, sizeof(prefix), "%.20s%d",
		(char *)ns->prefix, counter++);
	def = xmlSearchNs(doc, tree, prefix);
    }

    /*
     * OK, now we are ready to create a new one.
     */
    def = xmlNewNs(tree, ns->href, prefix);
    return(def);
}